

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskDataset.cpp
# Opt level: O2

bool __thiscall
OnDiskDataset::has_all_taints
          (OnDiskDataset *this,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *taints)

{
  size_type sVar1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  
  p_Var3 = &(taints->_M_t)._M_impl.super__Rb_tree_header;
  for (p_Var2 = (taints->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != p_Var3; p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    sVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(&this->taints,(key_type *)(p_Var2 + 1));
    if (sVar1 == 0) break;
  }
  return (_Rb_tree_header *)p_Var2 == p_Var3;
}

Assistant:

bool OnDiskDataset::has_all_taints(const std::set<std::string> &taints) const {
    for (const auto &taint : taints) {
        if (this->taints.count(taint) == 0) {
            return false;
        }
    }
    return true;
}